

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

edata_t * extent_try_coalesce_impl
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *edata,
                    _Bool *coalesced)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  edata_t *peVar4;
  edata_t *local_48;
  
  do {
    bVar2 = false;
    peVar4 = duckdb_je_emap_try_acquire_edata_neighbor
                       (tsdn,pac->emap,edata,EXTENT_PAI_PAC,ecache->state,true);
    if (peVar4 == (edata_t *)0x0) {
LAB_011973a7:
      peVar4 = duckdb_je_emap_try_acquire_edata_neighbor
                         (tsdn,pac->emap,edata,EXTENT_PAI_PAC,ecache->state,false);
      bVar1 = true;
      if ((peVar4 != (edata_t *)0x0) &&
         (_Var3 = extent_coalesce(tsdn,pac,ehooks,ecache,edata,peVar4,false), !_Var3)) {
        bVar1 = true;
        edata = peVar4;
        if (ecache->delay_coalesce == true) {
          *coalesced = true;
          bVar1 = false;
          local_48 = peVar4;
        }
        else {
          bVar2 = true;
        }
      }
    }
    else {
      _Var3 = extent_coalesce(tsdn,pac,ehooks,ecache,edata,peVar4,true);
      if (_Var3) {
        bVar2 = false;
        goto LAB_011973a7;
      }
      bVar2 = true;
      if (ecache->delay_coalesce != true) goto LAB_011973a7;
      *coalesced = true;
      bVar2 = false;
      bVar1 = false;
      local_48 = edata;
    }
    if (!bVar1) {
      return local_48;
    }
    if (!bVar2) {
      if (ecache->delay_coalesce == true) {
        *coalesced = false;
      }
      return edata;
    }
  } while( true );
}

Assistant:

static edata_t *
extent_try_coalesce_impl(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    ecache_t *ecache, edata_t *edata, bool *coalesced) {
	assert(!edata_guarded_get(edata));
	assert(coalesced != NULL);
	/*
	 * We avoid checking / locking inactive neighbors for large size
	 * classes, since they are eagerly coalesced on deallocation which can
	 * cause lock contention.
	 */
	/*
	 * Continue attempting to coalesce until failure, to protect against
	 * races with other threads that are thwarted by this one.
	 */
	bool again;
	do {
		again = false;

		/* Try to coalesce forward. */
		edata_t *next = emap_try_acquire_edata_neighbor(tsdn, pac->emap,
		    edata, EXTENT_PAI_PAC, ecache->state, /* forward */ true);
		if (next != NULL) {
			if (!extent_coalesce(tsdn, pac, ehooks, ecache, edata,
			    next, true)) {
				if (ecache->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return edata;
				}
				again = true;
			}
		}

		/* Try to coalesce backward. */
		edata_t *prev = emap_try_acquire_edata_neighbor(tsdn, pac->emap,
		    edata, EXTENT_PAI_PAC, ecache->state, /* forward */ false);
		if (prev != NULL) {
			if (!extent_coalesce(tsdn, pac, ehooks, ecache, edata,
			    prev, false)) {
				edata = prev;
				if (ecache->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return edata;
				}
				again = true;
			}
		}
	} while (again);

	if (ecache->delay_coalesce) {
		*coalesced = false;
	}
	return edata;
}